

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O1

void jsimd_h2v1_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  JSAMPLE JVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  JSAMPARRAY ppJVar10;
  ushort *puVar11;
  ulong uVar12;
  JSAMPROW pJVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  
  uVar12 = (ulong)cinfo->image_width;
  uVar9 = (ulong)(uint)cinfo->max_v_samp_factor;
  uVar2 = compptr->v_samp_factor;
  uVar5 = (ulong)uVar2;
  uVar6 = (ulong)compptr->width_in_blocks;
  if (((byte)simd_support & 0x80) == 0) {
    if (uVar6 != 0) {
      lVar7 = uVar6 * 0x10 - uVar12;
      if ((lVar7 != 0 && uVar12 <= uVar6 * 0x10) && (ppJVar10 = input_data, uVar9 != 0)) {
        do {
          JVar1 = (*ppJVar10 + uVar12)[-1];
          pJVar13 = *ppJVar10 + uVar12;
          for (lVar8 = lVar7; lVar8 != 0; lVar8 = lVar8 + -1) {
            *pJVar13 = JVar1;
            pJVar13 = pJVar13 + 1;
          }
          uVar4 = uVar9 - 1;
          bVar3 = 0 < (long)uVar9;
          uVar9 = uVar4;
          ppJVar10 = ppJVar10 + 1;
        } while (uVar4 != 0 && bVar3);
      }
      if (0 < (int)uVar2) {
        do {
          puVar11 = (ushort *)*input_data;
          pJVar13 = *output_data;
          uVar9 = uVar6 << 3;
          if (0xf < uVar6 << 3) goto jsimd_h2v1_downsample_sse2_columnloop;
          do {
            uVar14 = *puVar11;
            uVar15 = puVar11[1];
            uVar16 = puVar11[2];
            uVar17 = puVar11[3];
            uVar18 = puVar11[4];
            uVar19 = puVar11[5];
            uVar20 = puVar11[6];
            uVar21 = puVar11[7];
            uVar22 = 0;
            uVar23 = 0;
            uVar24 = 0;
            uVar25 = 0;
            uVar26 = 0;
            uVar27 = 0;
            uVar28 = 0;
            uVar29 = 0;
            uVar9 = 0x10;
            while( true ) {
              uVar14 = (ushort)((uVar14 & 0xff) + (uVar14 >> 8)) >> 1;
              uVar15 = (ushort)((uVar15 & 0xff) + (uVar15 >> 8) + 1) >> 1;
              uVar16 = (ushort)((uVar16 & 0xff) + (uVar16 >> 8)) >> 1;
              uVar17 = (ushort)((uVar17 & 0xff) + (uVar17 >> 8) + 1) >> 1;
              uVar18 = (ushort)((uVar18 & 0xff) + (uVar18 >> 8)) >> 1;
              uVar19 = (ushort)((uVar19 & 0xff) + (uVar19 >> 8) + 1) >> 1;
              uVar20 = (ushort)((uVar20 & 0xff) + (uVar20 >> 8)) >> 1;
              uVar21 = (ushort)((uVar21 & 0xff) + (uVar21 >> 8) + 1) >> 1;
              uVar22 = (ushort)((uVar22 & 0xff) + (uVar22 >> 8)) >> 1;
              uVar23 = (ushort)((uVar23 & 0xff) + (uVar23 >> 8) + 1) >> 1;
              uVar24 = (ushort)((uVar24 & 0xff) + (uVar24 >> 8)) >> 1;
              uVar25 = (ushort)((uVar25 & 0xff) + (uVar25 >> 8) + 1) >> 1;
              uVar26 = (ushort)((uVar26 & 0xff) + (uVar26 >> 8)) >> 1;
              uVar27 = (ushort)((uVar27 & 0xff) + (uVar27 >> 8) + 1) >> 1;
              uVar28 = (ushort)((uVar28 & 0xff) + (uVar28 >> 8)) >> 1;
              uVar29 = (ushort)((uVar29 & 0xff) + (uVar29 >> 8) + 1) >> 1;
              *pJVar13 = (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar14 - (0xff < uVar14);
              pJVar13[1] = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
              pJVar13[2] = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16);
              pJVar13[3] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
              pJVar13[4] = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
              pJVar13[5] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
              pJVar13[6] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
              pJVar13[7] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
              pJVar13[8] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
              pJVar13[9] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
              pJVar13[10] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
              pJVar13[0xb] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
              pJVar13[0xc] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
              pJVar13[0xd] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
              pJVar13[0xe] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
              pJVar13[0xf] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
              uVar9 = uVar9 - 0x10;
              puVar11 = puVar11 + 0x10;
              pJVar13 = pJVar13 + 0x10;
              if (uVar9 < 0x10) break;
jsimd_h2v1_downsample_sse2_columnloop:
              uVar14 = *puVar11;
              uVar15 = puVar11[1];
              uVar16 = puVar11[2];
              uVar17 = puVar11[3];
              uVar18 = puVar11[4];
              uVar19 = puVar11[5];
              uVar20 = puVar11[6];
              uVar21 = puVar11[7];
              uVar22 = puVar11[8];
              uVar23 = puVar11[9];
              uVar24 = puVar11[10];
              uVar25 = puVar11[0xb];
              uVar26 = puVar11[0xc];
              uVar27 = puVar11[0xd];
              uVar28 = puVar11[0xe];
              uVar29 = puVar11[0xf];
            }
          } while (uVar9 != 0);
          input_data = input_data + 1;
          output_data = output_data + 1;
          uVar9 = uVar5 - 1;
          bVar3 = 0 < (long)uVar5;
          uVar5 = uVar9;
        } while (uVar9 != 0 && bVar3);
      }
    }
    return;
  }
  jsimd_h2v1_downsample_avx2();
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v1_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                      JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_h2v1_downsample_avx2(cinfo->image_width, cinfo->max_v_samp_factor,
                               compptr->v_samp_factor,
                               compptr->width_in_blocks, input_data,
                               output_data);
  else
    jsimd_h2v1_downsample_sse2(cinfo->image_width, cinfo->max_v_samp_factor,
                               compptr->v_samp_factor,
                               compptr->width_in_blocks, input_data,
                               output_data);
}